

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O0

char * netaddr_to_prefixstring(netaddr_str *dst,netaddr *src,_Bool forceprefix)

{
  byte bVar1;
  char *pcVar2;
  size_t sVar3;
  netaddr_str *pnStack_38;
  int maxprefix;
  char *result;
  _Bool forceprefix_local;
  netaddr *src_local;
  netaddr_str *dst_local;
  
  if (src == (netaddr *)0x0) {
    dst_local = (netaddr_str *)strscpy(dst->buf,netaddr_to_prefixstring::NONE,0x3e);
  }
  else {
    bVar1 = netaddr_get_af_maxprefix((uint)src->_type);
    switch(src->_type) {
    case '\0':
    default:
      pcVar2 = strscpy(dst->buf,netaddr_to_prefixstring::NONE,0x3e);
      return pcVar2;
    case '\x02':
      pnStack_38 = (netaddr_str *)inet_ntop(2,src,dst->buf,0x3e);
      break;
    case '\n':
      pnStack_38 = (netaddr_str *)inet_ntop(10,src,dst->buf,0x3e);
      break;
    case '/':
      pnStack_38 = (netaddr_str *)_mac_to_string(dst->buf,0x3e,src,6,':');
      break;
    case '0':
      pnStack_38 = (netaddr_str *)_mac_to_string(dst->buf,0x3e,src,8,'-');
      break;
    case '1':
      pnStack_38 = (netaddr_str *)_uuid_to_string(dst->buf,0x3e,src,0x10);
    }
    if ((forceprefix) || (src->_prefix_len < bVar1)) {
      sVar3 = strlen(pnStack_38->buf);
      snprintf(dst->buf + sVar3,5,"/%d",(ulong)src->_prefix_len);
    }
    dst_local = pnStack_38;
  }
  return dst_local->buf;
}

Assistant:

const char *
netaddr_to_prefixstring(struct netaddr_str *dst, const struct netaddr *src, bool forceprefix) {
  static const char *NONE = "-";
  const char *result = NULL;
  int maxprefix;

  if (!src) {
    return strscpy(dst->buf, NONE, sizeof(*dst));
  }

  maxprefix = netaddr_get_maxprefix(src);
  switch (src->_type) {
    case AF_INET:
      result = inet_ntop(AF_INET, src->_addr, dst->buf, sizeof(*dst));
      break;
    case AF_INET6:
      result = inet_ntop(AF_INET6, src->_addr, dst->buf, sizeof(*dst));
      break;
    case AF_MAC48:
      result = _mac_to_string(dst->buf, sizeof(*dst), src->_addr, 6, ':');
      break;
    case AF_EUI64:
      result = _mac_to_string(dst->buf, sizeof(*dst), src->_addr, 8, '-');
      break;
    case AF_UUID:
      result = _uuid_to_string(dst->buf, sizeof(*dst), src->_addr, 16);
      break;
    case AF_UNSPEC:
      /* fall through */
    default:
      return strscpy(dst->buf, NONE, sizeof(*dst));
  }
  if (forceprefix || src->_prefix_len < maxprefix) {
    /* append prefix */
    snprintf(dst->buf + strlen(result), 5, "/%d", src->_prefix_len);
  }
  return result;
}